

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_Test::
~TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_Test
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_Test
           *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteOverloadsWithIntLineWorks)
{
    const int line = 42;
    char* leak = new("TestFile.cpp", line) char;

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}